

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmi_helper.c
# Opt level: O0

uint64_t helper_pmaddhw_mips64el(uint64_t fs,uint64_t ft)

{
  uint32_t p1;
  uint32_t p0;
  LMIValue vt;
  LMIValue vs;
  uint host;
  uint64_t ft_local;
  uint64_t fs_local;
  
  vt.uh[0] = (uint16_t)fs;
  p1._0_2_ = (short)ft;
  vt.uh[1] = (uint16_t)(fs >> 0x10);
  p1._2_2_ = (short)(ft >> 0x10);
  vt.uh[2] = (uint16_t)(fs >> 0x20);
  p0._0_2_ = (short)(ft >> 0x20);
  vt.uh[3] = (uint16_t)(fs >> 0x30);
  p0._2_2_ = (short)(ft >> 0x30);
  return CONCAT44((int)vt.sh[3] * (int)p0._2_2_ + (int)vt.sh[2] * (int)(short)p0,
                  (int)vt.sh[1] * (int)p1._2_2_ + (int)vt.sh[0] * (int)(short)p1);
}

Assistant:

uint64_t helper_pmaddhw(uint64_t fs, uint64_t ft)
{
    unsigned host = BYTE_ORDER_XOR(3);
    LMIValue vs, vt;
    uint32_t p0, p1;

    vs.d = fs;
    vt.d = ft;
    p0  = vs.sh[0 ^ host] * vt.sh[0 ^ host];
    p0 += vs.sh[1 ^ host] * vt.sh[1 ^ host];
    p1  = vs.sh[2 ^ host] * vt.sh[2 ^ host];
    p1 += vs.sh[3 ^ host] * vt.sh[3 ^ host];

    return ((uint64_t)p1 << 32) | p0;
}